

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_document_tag_directive_remove(fy_document *fyd,char *handle)

{
  fy_token *_n;
  fy_token *fyt;
  char *handle_local;
  fy_document *fyd_local;
  
  if (((fyd == (fy_document *)0x0) || (fyd->fyds == (fy_document_state *)0x0)) ||
     (handle == (char *)0x0)) {
    fyd_local._4_4_ = -1;
  }
  else {
    _n = fy_document_tag_directive_lookup(fyd,handle);
    if ((_n == (fy_token *)0x0) || (_n->refs != 1)) {
      fyd_local._4_4_ = -1;
    }
    else {
      fy_token_list_del(&fyd->fyds->fyt_td,_n);
      fy_token_unref(_n);
      fyd_local._4_4_ = 0;
    }
  }
  return fyd_local._4_4_;
}

Assistant:

int fy_document_tag_directive_remove(struct fy_document *fyd, const char *handle) {
    struct fy_token *fyt;

    if (!fyd || !fyd->fyds || !handle)
        return -1;

    /* it must not exist */
    fyt = fy_document_tag_directive_lookup(fyd, handle);
    if (!fyt || fyt->refs != 1)
        return -1;

    fy_token_list_del(&fyd->fyds->fyt_td, fyt);
    fy_token_unref(fyt);

    return 0;
}